

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

void __thiscall
testing::internal::
linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
::~linked_ptr(linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
              *this)

{
  TestInfo *this_00;
  bool bVar1;
  
  bVar1 = linked_ptr_internal::depart(&this->link_);
  if (bVar1) {
    this_00 = this->value_;
    if (this_00 != (TestInfo *)0x0) {
      scoped_ptr<testing::internal::TestMetaFactoryBase<char>_>::~scoped_ptr
                (&this_00->test_meta_factory);
      std::__cxx11::string::~string((string *)&this_00->test_base_name);
      std::__cxx11::string::~string((string *)this_00);
    }
    operator_delete(this_00,0x48);
    return;
  }
  return;
}

Assistant:

~linked_ptr() { depart(); }